

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O3

void WebPDeallocateAlphaMemory(VP8Decoder *dec)

{
  WebPSafeFree(dec->alpha_plane_mem_);
  dec->alpha_plane_mem_ = (uint8_t *)0x0;
  dec->alpha_plane_ = (uint8_t *)0x0;
  ALPHDelete(dec->alph_dec_);
  dec->alph_dec_ = (ALPHDecoder *)0x0;
  return;
}

Assistant:

void WebPDeallocateAlphaMemory(VP8Decoder* const dec) {
  assert(dec != NULL);
  WebPSafeFree(dec->alpha_plane_mem_);
  dec->alpha_plane_mem_ = NULL;
  dec->alpha_plane_ = NULL;
  ALPHDelete(dec->alph_dec_);
  dec->alph_dec_ = NULL;
}